

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.cpp
# Opt level: O0

uint32_t net_uv::net_getAddrPort(sockaddr *addr)

{
  ushort uVar1;
  sockaddr_in *addr_in_1;
  sockaddr_in6 *addr_in;
  uint32_t outPort;
  sockaddr *addr_local;
  
  if (addr->sa_family == 10) {
    uVar1 = ntohs(*(uint16_t *)addr->sa_data);
  }
  else {
    uVar1 = ntohs(*(uint16_t *)addr->sa_data);
  }
  addr_in._4_4_ = (uint)uVar1;
  return addr_in._4_4_;
}

Assistant:

uint32_t net_getAddrPort(const struct sockaddr* addr)
{
	uint32_t outPort = 0;
	if (addr->sa_family == AF_INET6)
	{
		const struct sockaddr_in6* addr_in = (const struct sockaddr_in6*) addr;
		outPort = ntohs(addr_in->sin6_port);
	}
	else
	{
		const struct sockaddr_in* addr_in = (const struct sockaddr_in*) addr;
		outPort = ntohs(addr_in->sin_port);
	}
	return outPort;
}